

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

TokenPattern * __thiscall
TokenPattern::doCat(TokenPattern *__return_storage_ptr__,TokenPattern *this,TokenPattern *tokpat)

{
  pointer *pppTVar1;
  iterator __position;
  int iVar2;
  pointer ppTVar3;
  undefined4 extraout_var;
  LowlevelError *pLVar4;
  ulong uVar5;
  uint uVar6;
  string local_50;
  
  (__return_storage_ptr__->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->pattern = (Pattern *)0x0;
  (__return_storage_ptr__->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__->leftellipsis = false;
  __return_storage_ptr__->rightellipsis = false;
  __return_storage_ptr__->leftellipsis = this->leftellipsis;
  __return_storage_ptr__->rightellipsis = this->rightellipsis;
  std::vector<Token_*,_std::allocator<Token_*>_>::operator=
            (&__return_storage_ptr__->toklist,&this->toklist);
  if (this->rightellipsis == false) {
    if (tokpat->leftellipsis != true) {
      uVar6 = 0;
      for (ppTVar3 = (this->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppTVar3 !=
          (this->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
        uVar6 = uVar6 + *(int *)(*ppTVar3 + 0x20);
      }
      for (ppTVar3 = (tokpat->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          ppTVar3 !=
          (tokpat->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
        __position._M_current =
             (__return_storage_ptr__->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                    ((vector<Token*,std::allocator<Token*>> *)&__return_storage_ptr__->toklist,
                     __position,ppTVar3);
        }
        else {
          *__position._M_current = *ppTVar3;
          pppTVar1 = &(__return_storage_ptr__->toklist).
                      super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      __return_storage_ptr__->rightellipsis = tokpat->rightellipsis;
      goto LAB_0032b3b3;
    }
  }
  else {
    iVar2 = (*tokpat->pattern->_vptr_Pattern[0xc])();
    if ((char)iVar2 == '\0') {
      pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Interior ellipsis in pattern","");
      LowlevelError::LowlevelError(pLVar4,&local_50);
      __cxa_throw(pLVar4,&SleighError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  uVar6 = 0xffffffff;
  if (tokpat->leftellipsis == true) {
    iVar2 = (*this->pattern->_vptr_Pattern[0xc])();
    if ((char)iVar2 == '\0') {
      pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Interior ellipsis in pattern","");
      LowlevelError::LowlevelError(pLVar4,&local_50);
      __cxa_throw(pLVar4,&SleighError::typeinfo,LowlevelError::~LowlevelError);
    }
    __return_storage_ptr__->leftellipsis = true;
  }
LAB_0032b3b3:
  if ((__return_storage_ptr__->rightellipsis == true) &&
     (__return_storage_ptr__->leftellipsis == true)) {
    pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Double ellipsis in pattern","");
    LowlevelError::LowlevelError(pLVar4,&local_50);
    __cxa_throw(pLVar4,&SleighError::typeinfo,LowlevelError::~LowlevelError);
  }
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = (ulong)uVar6;
  }
  iVar2 = (*this->pattern->_vptr_Pattern[5])(this->pattern,tokpat->pattern,uVar5);
  __return_storage_ptr__->pattern = (Pattern *)CONCAT44(extraout_var,iVar2);
  return __return_storage_ptr__;
}

Assistant:

TokenPattern TokenPattern::doCat(const TokenPattern &tokpat) const

{				// Return Concatenation of -this- and -tokpat-
  TokenPattern res((Pattern *)0);
  int4 sa;

  res.leftellipsis = leftellipsis;
  res.rightellipsis = rightellipsis;
  res.toklist = toklist;
  if (rightellipsis||tokpat.leftellipsis) { // Check for interior ellipsis
    if (rightellipsis) {
      if (!tokpat.alwaysInstructionTrue())
	throw SleighError("Interior ellipsis in pattern");
    }
    if (tokpat.leftellipsis) {
      if (!alwaysInstructionTrue())
	throw SleighError("Interior ellipsis in pattern");
      res.leftellipsis = true;
    }
    sa = -1;
  }
  else {
    sa = 0;
    vector<Token *>::const_iterator iter;

    for(iter=toklist.begin();iter!=toklist.end();++iter)
      sa += (*iter)->getSize();
    for(iter=tokpat.toklist.begin();iter!=tokpat.toklist.end();++iter)
      res.toklist.push_back(*iter);
    res.rightellipsis = tokpat.rightellipsis;
  }
  if (res.rightellipsis && res.leftellipsis)
    throw SleighError("Double ellipsis in pattern");
  if (sa < 0)
    res.pattern = pattern->doAnd(tokpat.pattern,0);
  else
    res.pattern = pattern->doAnd(tokpat.pattern,sa);
  return res;
}